

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O2

void __thiscall
bioparser::test::BioparserParserTest_Create_Test::TestBody(BioparserParserTest_Create_Test *this)

{
  pointer *__ptr;
  undefined1 local_48 [16];
  AssertionResult gtest_ar;
  
  std::__cxx11::string::string((string *)&gtest_ar,"",(allocator *)(local_48 + 8));
  Parser<biosoup::Sequence>::Create<bioparser::FastaParser>
            ((Parser<biosoup::Sequence> *)local_48,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if ((_func_int **)local_48._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_48._0_8_ + 8))();
  }
  return;
}

Assistant:

TEST(BioparserParserTest, Create) {
  try {
    auto p = Parser<biosoup::Sequence>::Create<FastaParser>("");
  } catch (std::invalid_argument& exception) {
    EXPECT_STREQ(
        exception.what(),
        "[bioparser::Parser::Create] error: unable to open file ");
  }
}